

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall BpTree<float>::FindKey(BpTree<float> *this,float k,IndexNode<float> *C)

{
  float fVar1;
  pointer pcVar2;
  pointer pfVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Addr *pAVar8;
  ulong uVar9;
  ulong uVar10;
  IndexNode<float> D;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&D,this->N);
  uVar7 = 0xffffffff;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
LAB_0012b6b5:
    uVar5 = this->N - 1;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    pcVar2 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (C->NodeState != '1') {
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        if ((pcVar2[uVar9] != '1') || (k < pfVar3[uVar9] || k == pfVar3[uVar9])) {
          uVar6 = uVar9 & 0xffffffff;
          break;
        }
      }
      if (((uint)uVar6 == uVar5) || (pcVar2[uVar6] == '0')) goto LAB_0012b703;
      fVar1 = pfVar3[uVar6];
      if ((fVar1 != k) || (NAN(fVar1) || NAN(k))) goto LAB_0012b777;
      FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6],&D);
      IndexNode<float>::IndexNode(&local_90,&D);
      iVar4 = HaveK(this,&local_90,k);
      IndexNode<float>::~IndexNode(&local_90);
      pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6 + (iVar4 == 0);
      goto LAB_0012b70b;
    }
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      if (pcVar2[uVar9] != '1') {
LAB_0012b7ae:
        uVar6 = uVar9 & 0xffffffff;
        break;
      }
      if ((pfVar3[uVar9] == k) && (!NAN(pfVar3[uVar9]) && !NAN(k))) goto LAB_0012b7ae;
    }
    uVar7 = 0xffffffff;
    if (((uint)uVar6 != uVar5) && (uVar7 = 0xffffffff, pcVar2[uVar6] != '0')) {
      uVar7 = (uint)uVar6;
    }
  }
  IndexNode<float>::~IndexNode(&D);
  return uVar7;
LAB_0012b777:
  if (k < fVar1) {
LAB_0012b703:
    pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar6;
LAB_0012b70b:
    FindNode(this,*pAVar8,C);
  }
  goto LAB_0012b6b5;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}